

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O0

string * make_full_var_name_abi_cxx11_(char *module_name,char *var_name)

{
  int iVar1;
  char *pcVar2;
  char *in_RDX;
  long in_RSI;
  string *in_RDI;
  string *full_name;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  string *__a;
  ushort in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  undefined5 in_stack_ffffffffffffffbb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_38 [32];
  char *local_18;
  string *name;
  
  __a = in_RDI;
  name = in_RDI;
  if (((in_RSI == 0) ||
      (local_18 = in_RDX, iVar1 = streq(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78),
      iVar1 != 0)) || (pcVar2 = strstr(local_18,"::"), pcVar2 != (char *)0x0)) {
    extract_module_name_abi_cxx11_((char *)name);
    std::__cxx11::string::c_str();
    iVar1 = streq(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(local_38);
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffc0,
                 (char *)CONCAT53(in_stack_ffffffffffffffbb,
                                  CONCAT12(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8)),
                 (allocator<char> *)__a);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbb);
    }
    else {
      extract_var_name_abi_cxx11_((char *)name);
    }
  }
  else {
    normalized_module_name_abi_cxx11_
              ((char *)CONCAT53(in_stack_ffffffffffffffbb,(uint3)in_stack_ffffffffffffffb8));
    std::__cxx11::string::operator+=((string *)in_RDI,"::");
    std::__cxx11::string::operator+=((string *)in_RDI,local_18);
  }
  return __a;
}

Assistant:

string make_full_var_name(const char* module_name, const char* var_name)
	{
	if ( ! module_name || streq(module_name, GLOBAL_MODULE_NAME) || strstr(var_name, "::") )
		{
		if ( streq(GLOBAL_MODULE_NAME, extract_module_name(var_name).c_str()) )
			return extract_var_name(var_name);

		return string(var_name);
		}

	string full_name = normalized_module_name(module_name);
	full_name += "::";
	full_name += var_name;

	return full_name;
	}